

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

void __thiscall
icu_63::ZNames::ZNamesLoader::put
          (ZNamesLoader *this,char *key,ResourceValue *value,UBool param_3,UErrorCode *errorCode)

{
  UBool UVar1;
  int iVar2;
  undefined7 in_register_00000009;
  ResourceValue *value_00;
  int32_t i;
  int i_00;
  ResourceTable namesTable;
  char *local_60;
  ResourceTable local_58;
  
  local_60 = key;
  (*(value->super_UObject)._vptr_UObject[0xb])
            (&local_58,value,errorCode,CONCAT71(in_register_00000009,param_3));
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    i_00 = 0;
    while (UVar1 = ResourceTable::getKeyAndValue(&local_58,i_00,&local_60,value), UVar1 != '\0') {
      iVar2 = (*(value->super_UObject)._vptr_UObject[0xc])(value);
      value_00 = value;
      if ((char)iVar2 != '\0') {
        value_00 = (ResourceValue *)0x0;
      }
      setNameIfEmpty(this,local_60,value_00,errorCode);
      i_00 = i_00 + 1;
    }
  }
  return;
}

Assistant:

virtual void put(const char* key, ResourceValue& value, UBool /*noFallback*/,
            UErrorCode &errorCode) {
        ResourceTable namesTable = value.getTable(errorCode);
        if (U_FAILURE(errorCode)) { return; }
        for (int32_t i = 0; namesTable.getKeyAndValue(i, key, value); ++i) {
            if (value.isNoInheritanceMarker()) {
                setNameIfEmpty(key, NULL, errorCode);
            } else {
                setNameIfEmpty(key, &value, errorCode);
            }
        }
    }